

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O3

bool P_CheckSwitchRange(AActor *user,line_t *line,int sideno,DVector3 *optpos)

{
  int iVar1;
  int iVar2;
  side_t *psVar3;
  extsector_t *peVar4;
  long *plVar5;
  double *pdVar6;
  F3DFloor *pFVar7;
  uint uVar8;
  AActor *pAVar9;
  bool bVar10;
  subsector_t *psVar11;
  FSwitchDef *pFVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  sector_t *psVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  double checkbot;
  double checktop;
  FLineOpening open;
  DVector2 local_158;
  sector_t *local_148;
  AActor *local_140;
  double local_138;
  double local_130;
  divline_t local_128;
  DVector2 local_108;
  double local_f8;
  FLineOpening local_e8;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  
  psVar3 = line->sidedef[sideno];
  if (psVar3 != (side_t *)0x0) {
    uVar8 = line->flags & 0xffdfffff;
    if (0 < psVar3->textures[1].texture.texnum) {
      uVar8 = line->flags;
    }
    if ((uVar8 & 0x600000) != 0) {
      local_148 = psVar3->sector;
      local_128.x = (line->v1->p).X;
      local_128.y = (line->v1->p).Y;
      local_128.dx = (line->delta).X;
      local_128.dy = (line->delta).Y;
      if (optpos == (DVector3 *)0x0) {
        local_f8 = (user->__Pos).Z;
        iVar1 = user->Sector->PortalGroup;
        iVar2 = line->frontsector->PortalGroup;
        dVar18 = 0.0;
        dVar19 = 0.0;
        if (iVar1 != iVar2) {
          dVar18 = Displacements.data.Array[iVar2 * Displacements.size + iVar1].pos.X;
          dVar19 = Displacements.data.Array[iVar2 * Displacements.size + iVar1].pos.Y;
        }
        dVar18 = (user->__Pos).X + dVar18;
        dVar19 = (user->__Pos).Y + dVar19;
        local_108.Y._0_4_ = SUB84(dVar19,0);
        local_108.X = dVar18;
        local_108.Y._4_4_ = (int)((ulong)dVar19 >> 0x20);
      }
      else {
        dVar18 = optpos->X;
        dVar19 = optpos->Y;
        local_108.X = optpos->X;
        local_108.Y = optpos->Y;
        local_f8 = optpos->Z;
      }
      local_58._8_4_ = SUB84(dVar19,0);
      local_58._0_8_ = dVar18;
      local_58._12_4_ = (int)((ulong)dVar19 >> 0x20);
      local_48 = FFastTrig::cos(&fasttrig,
                                (user->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0
                               );
      local_140 = user;
      local_40 = FFastTrig::sin(&fasttrig,
                                (user->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0
                               );
      dVar18 = P_InterceptVector(&local_128,(divline_t *)local_58);
      if ((line->sidedef[0]->Flags & 0x40) == 0) {
        dVar19 = local_128.y + local_128.dy * dVar18;
        local_158.Y._0_4_ = SUB84(dVar19,0);
        local_158.X = local_128.x + local_128.dx * dVar18;
        local_158.Y._4_4_ = (int)((ulong)dVar19 >> 0x20);
        psVar16 = local_148;
      }
      else {
        dVar19 = local_128.x + local_128.dx * (dVar18 + 0.01);
        dVar18 = local_128.y + local_128.dy * (dVar18 + 0.01);
        local_158.Y._0_4_ = SUB84(dVar18,0);
        local_158.X = dVar19;
        local_158.Y._4_4_ = (int)((ulong)dVar18 >> 0x20);
        psVar11 = P_PointInSubsector(dVar19,dVar18);
        psVar16 = psVar11->sector;
      }
      pAVar9 = local_140;
      if (((line->sidedef[1] == (side_t *)0x0) || ((line->sidedef[0]->Flags & 0x40) != 0)) ||
         (P_LineOpening(&local_e8,(AActor *)0x0,line,&local_158,&local_108,0), local_e8.range <= 0.0
         )) {
        dVar18 = (pAVar9->__Pos).Z;
        if (pAVar9->Height + dVar18 <
            ((psVar16->floorplane).normal.Y * local_158.Y +
            (psVar16->floorplane).D + (psVar16->floorplane).normal.X * local_158.X) *
            (psVar16->floorplane).negiC) {
          return false;
        }
        return dVar18 <= (local_158.Y * (psVar16->ceilingplane).normal.Y +
                         (psVar16->ceilingplane).D + local_158.X * (psVar16->ceilingplane).normal.X)
                         * (psVar16->ceilingplane).negiC;
      }
      pFVar12 = FTextureManager::FindSwitch(&TexMan,(FTextureID)psVar3->textures[0].texture.texnum);
      if (pFVar12 == (FSwitchDef *)0x0) {
        pFVar12 = FTextureManager::FindSwitch
                            (&TexMan,(FTextureID)psVar3->textures[2].texture.texnum);
        if (pFVar12 == (FSwitchDef *)0x0) {
          if (((uVar8 >> 0x15 & 1) == 0) &&
             (pFVar12 = FTextureManager::FindSwitch
                                  (&TexMan,(FTextureID)psVar3->textures[1].texture.texnum),
             pFVar12 == (FSwitchDef *)0x0)) {
            dVar18 = (pAVar9->__Pos).Z;
            if (local_e8.top < pAVar9->Height + dVar18) {
              return true;
            }
            bVar10 = local_e8.bottom + -1.52587890625e-05 == dVar18;
            bVar17 = local_e8.bottom + -1.52587890625e-05 < dVar18;
          }
          else {
            bVar10 = P_GetMidTexturePosition(line,sideno,&local_130,&local_138);
            if (!bVar10) {
              return false;
            }
            dVar18 = (pAVar9->__Pos).Z;
            if (local_130 + -1.52587890625e-05 <= dVar18) {
              return false;
            }
            dVar18 = dVar18 + pAVar9->Height;
            bVar10 = dVar18 == local_138;
            bVar17 = dVar18 < local_138;
          }
        }
        else {
          peVar4 = line->sidedef[1 - sideno]->sector->e;
          uVar13 = (ulong)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          if (uVar13 != 0) {
            uVar15 = 0;
            do {
              pFVar7 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar15];
              if ((~pFVar7->flags & 0x40001) == 0) {
                pdVar6 = (double *)(pFVar7->top).plane;
                dVar18 = (pAVar9->__Pos).Z;
                if ((dVar18 <= (pdVar6[1] * local_158.Y + pdVar6[3] + *pdVar6 * local_158.X) *
                               pdVar6[4] + 1.52587890625e-05) &&
                   (pdVar6 = *(double **)&pFVar7->bottom,
                   (pdVar6[1] * local_158.Y + pdVar6[3] + *pdVar6 * local_158.X) * pdVar6[4] <=
                   dVar18 + pAVar9->Height)) {
                  return true;
                }
              }
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
          }
          pdVar6 = &(pAVar9->__Pos).Z;
          bVar10 = local_e8.bottom == *pdVar6;
          bVar17 = local_e8.bottom < *pdVar6;
        }
      }
      else {
        peVar4 = line->sidedef[1 - sideno]->sector->e;
        uVar13 = (ulong)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        if (uVar13 != 0) {
          lVar14 = 0;
          do {
            plVar5 = *(long **)((long)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                      Array + lVar14);
            if ((~*(uint *)(plVar5 + 0xb) & 0x20001) == 0) {
              pdVar6 = (double *)plVar5[5];
              dVar18 = (pAVar9->__Pos).Z;
              if ((dVar18 <= (pdVar6[1] * local_158.Y + pdVar6[3] + *pdVar6 * local_158.X) *
                             pdVar6[4] + 1.52587890625e-05) &&
                 (pdVar6 = (double *)*plVar5,
                 (pdVar6[1] * local_158.Y + pdVar6[3] + *pdVar6 * local_158.X) * pdVar6[4] <=
                 dVar18 + pAVar9->Height)) {
                return true;
              }
            }
            lVar14 = lVar14 + 8;
          } while (uVar13 << 3 != lVar14);
        }
        dVar18 = (pAVar9->__Pos).Z + pAVar9->Height;
        bVar10 = dVar18 == local_e8.top;
        bVar17 = dVar18 < local_e8.top;
      }
      return !bVar17 && !bVar10;
    }
  }
  return true;
}

Assistant:

bool P_CheckSwitchRange(AActor *user, line_t *line, int sideno, const DVector3 *optpos)
{
	// Activated from an empty side -> always succeed
	side_t *side = line->sidedef[sideno];
	if (side == NULL)
		return true;

	double checktop;
	double checkbot;
	sector_t *front = side->sector;
	FLineOpening open;
	int flags = line->flags;

	if (!side->GetTexture(side_t::mid).isValid())
	{ // Do not force range checks for 3DMIDTEX lines if there is no actual midtexture.
		flags &= ~ML_3DMIDTEX;
	}

	// 3DMIDTEX forces CHECKSWITCHRANGE because otherwise it might cause problems.
	if (!(flags & (ML_3DMIDTEX|ML_CHECKSWITCHRANGE)))
		return true;

	// calculate the point where the user would touch the wall.
	divline_t dll, dlu;
	double inter;
	DVector2 check;

	P_MakeDivline (line, &dll);

	DVector3 pos = optpos? *optpos : user->PosRelative(line);
	dlu.x = pos.X;
	dlu.y = pos.Y;
	dlu.dx = user->Angles.Yaw.Cos();
	dlu.dy = user->Angles.Yaw.Sin();
	inter = P_InterceptVector(&dll, &dlu);


	// Polyobjects must test the containing sector, not the one they originate from.
	if (line->sidedef[0]->Flags & WALLF_POLYOBJ)
	{
		// Get a check point slightly inside the polyobject so that this still works
		// if the polyobject lies directly on a sector boundary
		check.X = dll.x + dll.dx * (inter + 0.01);
		check.Y = dll.y + dll.dy * (inter + 0.01);
		front = P_PointInSector(check);
	}
	else
	{
		check.X = dll.x + dll.dx * inter;
		check.Y = dll.y + dll.dy * inter;
	}


	// one sided line or polyobject
	if (line->sidedef[1] == NULL || (line->sidedef[0]->Flags & WALLF_POLYOBJ))
	{
	onesided:
		double sectorc = front->ceilingplane.ZatPoint(check);
		double sectorf = front->floorplane.ZatPoint(check);
		return (user->Top() >= sectorf && user->Z() <= sectorc);
	}

	// Now get the information from the line.
	P_LineOpening(open, NULL, line, check, &pos);
	if (open.range <= 0)
		goto onesided;

	if ((TexMan.FindSwitch(side->GetTexture(side_t::top))) != NULL)
	{

		// Check 3D floors on back side
		{
			sector_t * back = line->sidedef[1 - sideno]->sector;
			for (auto rover : back->e->XFloor.ffloors)
			{
				if (!(rover->flags & FF_EXISTS)) continue;
				if (!(rover->flags & FF_UPPERTEXTURE)) continue;

				if (user->isAbove(rover->top.plane->ZatPoint(check)) ||
					user->Top() < rover->bottom.plane->ZatPoint(check))
					continue;

				// This 3D floor depicts a switch texture in front of the player's eyes
				return true;
			}
		}

		return (user->Top() > open.top);
	}
	else if ((TexMan.FindSwitch(side->GetTexture(side_t::bottom))) != NULL)
	{
		// Check 3D floors on back side
		{
			sector_t * back = line->sidedef[1 - sideno]->sector;
			for (unsigned i = 0; i < back->e->XFloor.ffloors.Size(); i++)
			{
				F3DFloor *rover = back->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;
				if (!(rover->flags & FF_LOWERTEXTURE)) continue;

				if (user->isAbove(rover->top.plane->ZatPoint(check)) ||
					user->Top() < rover->bottom.plane->ZatPoint(check))
					continue;

				// This 3D floor depicts a switch texture in front of the player's eyes
				return true;
			}
		}

		return (user->Z() < open.bottom);
	}
	else if ((flags & ML_3DMIDTEX) || (TexMan.FindSwitch(side->GetTexture(side_t::mid))) != NULL)
	{
		// 3DMIDTEX lines will force a mid texture check if no switch is found on this line
		// to keep compatibility with Eternity's implementation.
		if (!P_GetMidTexturePosition(line, sideno, &checktop, &checkbot))
			return false;
		return user->isBelow(checktop) && user->Top() > checkbot;
	}
	else
	{
		// no switch found. Check whether the player can touch either top or bottom texture
		return (user->Top() > open.top) || (user->isBelow(open.bottom));
	}
}